

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::UnaryFunctionLayerParams::ByteSizeLong(UnaryFunctionLayerParams *this)

{
  UnaryFunctionLayerParams_Operation UVar1;
  int iVar2;
  float fVar3;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  UnaryFunctionLayerParams *this_local;
  
  sStack_18 = 0;
  UVar1 = type(this);
  if (UVar1 != UnaryFunctionLayerParams_Operation_SQRT) {
    UVar1 = type(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::EnumSize(UVar1);
    sStack_18 = sStack_18 + 1;
  }
  fVar3 = alpha(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar3 = epsilon(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar3 = shift(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = sStack_18 + 5;
  }
  fVar3 = scale(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    sStack_18 = sStack_18 + 5;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t UnaryFunctionLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UnaryFunctionLayerParams)
  size_t total_size = 0;

  // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
  if (this->type() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->type());
  }

  // float alpha = 2;
  if (this->alpha() != 0) {
    total_size += 1 + 4;
  }

  // float epsilon = 3;
  if (this->epsilon() != 0) {
    total_size += 1 + 4;
  }

  // float shift = 4;
  if (this->shift() != 0) {
    total_size += 1 + 4;
  }

  // float scale = 5;
  if (this->scale() != 0) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}